

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

char * Abc_SopFromTruthHex(char *pTruth)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  Vec_Int_t *p;
  uint local_54;
  Vec_Int_t *vMints;
  int local_40;
  int b;
  int i;
  int Mint;
  int Length;
  int Digit;
  int nVars;
  int nTruthSize;
  char *pCube;
  char *pSopCover;
  char *pTruth_local;
  
  sVar3 = strlen(pTruth);
  uVar2 = (uint)sVar3;
  if ((int)uVar2 < 2) {
    local_54 = 2;
  }
  else {
    iVar1 = Abc_Base2Log(uVar2);
    local_54 = iVar1 + 2;
  }
  if (uVar2 == 1 << ((char)local_54 - 2U & 0x1f)) {
    p = Vec_IntAlloc(100);
    for (local_40 = 0; local_40 < (int)uVar2; local_40 = local_40 + 1) {
      if ((pTruth[local_40] < '0') || ('9' < pTruth[local_40])) {
        if ((pTruth[local_40] < 'a') || ('f' < pTruth[local_40])) {
          if ((pTruth[local_40] < 'A') || ('F' < pTruth[local_40])) {
            printf("String %s does not look like a hexadecimal representation of the truth table.\n"
                   ,pTruth);
            return (char *)0x0;
          }
          Mint = pTruth[local_40] + -0x37;
        }
        else {
          Mint = pTruth[local_40] + -0x57;
        }
      }
      else {
        Mint = pTruth[local_40] + -0x30;
      }
      for (vMints._4_4_ = 0; vMints._4_4_ < 4; vMints._4_4_ = vMints._4_4_ + 1) {
        if ((Mint & 1 << ((byte)vMints._4_4_ & 0x1f)) != 0) {
          Vec_IntPush(p,((uVar2 - 1) - local_40) * 4 + vMints._4_4_);
        }
      }
    }
    iVar1 = Vec_IntSize(p);
    iVar1 = iVar1 * (local_54 + 3);
    pTruth_local = (char *)malloc((long)(iVar1 + 1));
    pTruth_local[iVar1] = '\0';
    for (local_40 = 0; iVar1 = Vec_IntSize(p), local_40 < iVar1; local_40 = local_40 + 1) {
      uVar2 = Vec_IntEntry(p,local_40);
      iVar1 = local_40 * (local_54 + 3);
      for (vMints._4_4_ = 0; vMints._4_4_ < (int)local_54; vMints._4_4_ = vMints._4_4_ + 1) {
        if ((uVar2 & 1 << ((byte)vMints._4_4_ & 0x1f)) == 0) {
          pTruth_local[(long)vMints._4_4_ + (long)iVar1] = '0';
        }
        else {
          pTruth_local[(long)vMints._4_4_ + (long)iVar1] = '1';
        }
      }
      pTruth_local[(long)(int)local_54 + (long)iVar1] = ' ';
      pTruth_local[(long)(int)(local_54 + 1) + (long)iVar1] = '1';
      pTruth_local[(long)(int)(local_54 + 2) + (long)iVar1] = '\n';
    }
    Vec_IntFree(p);
  }
  else {
    printf("String %s does not look like a truth table of a %d-variable function.\n",pTruth,
           (ulong)local_54);
    pTruth_local = (char *)0x0;
  }
  return pTruth_local;
}

Assistant:

char * Abc_SopFromTruthHex( char * pTruth )
{
    char * pSopCover, * pCube;
    int nTruthSize, nVars, Digit, Length, Mint, i, b;
    Vec_Int_t * vMints;

    // get the number of variables
    nTruthSize = strlen(pTruth);
    nVars = (nTruthSize < 2) ? 2 : Abc_Base2Log(nTruthSize) + 2;
    if ( nTruthSize != (1 << (nVars-2)) )
    {
        printf( "String %s does not look like a truth table of a %d-variable function.\n", pTruth, nVars );
        return NULL;
    }

    // collect the on-set minterms
    vMints = Vec_IntAlloc( 100 );
    for ( i = 0; i < nTruthSize; i++ )
    {
        if ( pTruth[i] >= '0' && pTruth[i] <= '9' )
            Digit = pTruth[i] - '0';
        else if ( pTruth[i] >= 'a' && pTruth[i] <= 'f' )
            Digit = 10 + pTruth[i] - 'a';
        else if ( pTruth[i] >= 'A' && pTruth[i] <= 'F' )
            Digit = 10 + pTruth[i] - 'A';
        else
        {
            printf( "String %s does not look like a hexadecimal representation of the truth table.\n", pTruth );
            return NULL;
        }
        for ( b = 0; b < 4; b++ )
            if ( Digit & (1 << b) )
                Vec_IntPush( vMints, 4*(nTruthSize-1-i)+b );
    }

    // create the SOP representation of the minterms
    Length = Vec_IntSize(vMints) * (nVars + 3);
    pSopCover = ABC_ALLOC( char, Length + 1 );
    pSopCover[Length] = 0;
    Vec_IntForEachEntry( vMints, Mint, i )
    {
        pCube = pSopCover + i * (nVars + 3);
        for ( b = 0; b < nVars; b++ )
//            if ( Mint & (1 << (nVars-1-b)) )
            if ( Mint & (1 << b) )
                pCube[b] = '1';
            else
                pCube[b] = '0';
        pCube[nVars + 0] = ' ';
        pCube[nVars + 1] = '1';
        pCube[nVars + 2] = '\n';
    }
/*
    // create TT representation
    {
        extern void Bdc_ManDecomposeTest( unsigned uTruth, int nVars );
        unsigned uTruth = 0;
        int nVarsAll = 4;
        assert( nVarsAll == 4 );
        assert( nVars <= nVarsAll );
        Vec_IntForEachEntry( vMints, Mint, i )
            uTruth |= (1 << Mint);
//        uTruth = uTruth | (uTruth << 8) | (uTruth << 16) | (uTruth << 24);
        uTruth = uTruth | (uTruth << 16);
        Bdc_ManDecomposeTest( uTruth, nVarsAll );
    }
*/
    Vec_IntFree( vMints );
    return pSopCover;
}